

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O0

int __thiscall btConvexHullInternal::Rational64::compare(Rational64 *this,Rational64 *b)

{
  long in_RSI;
  uint64_t in_RDI;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar1;
  Int128 local_38;
  Int128 local_28 [2];
  int local_4;
  
  if (*(int *)(in_RDI + 0x10) == *(int *)(in_RSI + 0x10)) {
    if (*(int *)(in_RDI + 0x10) == 0) {
      local_4 = 0;
    }
    else {
      iVar1 = *(int *)(in_RDI + 0x10);
      local_28[0] = Int128::mul(in_RDI,CONCAT44(iVar1,in_stack_ffffffffffffffb8));
      local_38 = Int128::mul(in_RDI,CONCAT44(iVar1,in_stack_ffffffffffffffb8));
      local_4 = Int128::ucmp(local_28,&local_38);
      local_4 = iVar1 * local_4;
    }
  }
  else {
    local_4 = *(int *)(in_RDI + 0x10) - *(int *)(in_RSI + 0x10);
  }
  return local_4;
}

Assistant:

int btConvexHullInternal::Rational64::compare(const Rational64& b) const
{
	if (sign != b.sign)
	{
		return sign - b.sign;
	}
	else if (sign == 0)
	{
		return 0;
	}

	//	return (numerator * b.denominator > b.numerator * denominator) ? sign : (numerator * b.denominator < b.numerator * denominator) ? -sign : 0;

#ifdef USE_X86_64_ASM

	int result;
	int64_t tmp;
	int64_t dummy;
	__asm__ ("mulq %[bn]\n\t"
					 "movq %%rax, %[tmp]\n\t"
					 "movq %%rdx, %%rbx\n\t"
					 "movq %[tn], %%rax\n\t"
					 "mulq %[bd]\n\t"
					 "subq %[tmp], %%rax\n\t"
					 "sbbq %%rbx, %%rdx\n\t" // rdx:rax contains 128-bit-difference "numerator*b.denominator - b.numerator*denominator"
					 "setnsb %%bh\n\t" // bh=1 if difference is non-negative, bh=0 otherwise
					 "orq %%rdx, %%rax\n\t"
					 "setnzb %%bl\n\t" // bl=1 if difference if non-zero, bl=0 if it is zero
					 "decb %%bh\n\t" // now bx=0x0000 if difference is zero, 0xff01 if it is negative, 0x0001 if it is positive (i.e., same sign as difference)
					 "shll $16, %%ebx\n\t" // ebx has same sign as difference
					 : "=&b"(result), [tmp] "=&r"(tmp), "=a"(dummy)
					 : "a"(denominator), [bn] "g"(b.numerator), [tn] "g"(numerator), [bd] "g"(b.denominator)
					 : "%rdx", "cc" );
	return result ? result ^ sign // if sign is +1, only bit 0 of result is inverted, which does not change the sign of result (and cannot result in zero)
																// if sign is -1, all bits of result are inverted, which changes the sign of result (and again cannot result in zero)
								: 0;

#else

	return sign * Int128::mul(m_numerator, b.m_denominator).ucmp(Int128::mul(m_denominator, b.m_numerator));

#endif
}